

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::SetPermissions(string *file,mode_t mode)

{
  char *__file;
  bool bVar1;
  int iVar2;
  mode_t mode_local;
  string *file_local;
  
  bVar1 = FileExists(file);
  if (bVar1) {
    __file = (char *)std::__cxx11::string::c_str();
    iVar2 = chmod(__file,mode);
    if (iVar2 < 0) {
      file_local._7_1_ = false;
    }
    else {
      file_local._7_1_ = true;
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool SystemTools::SetPermissions(const kwsys_stl::string& file, mode_t mode)
{
  if ( !SystemTools::FileExists(file) )
    {
    return false;
    }
#ifdef _WIN32
  if ( _wchmod(SystemTools::ConvertToWindowsExtendedPath(file).c_str(),
               mode) < 0 )
#else
  if ( chmod(file.c_str(), mode) < 0 )
#endif
    {
    return false;
    }

  return true;
}